

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.hpp
# Opt level: O2

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* __thiscall
TasGrid::GridSequence::cacheBasisValues<double>
          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *__return_storage_ptr__,GridSequence *this,double *x)

{
  double dVar1;
  uint uVar2;
  undefined8 *puVar3;
  pointer pdVar4;
  ulong uVar5;
  int j;
  long lVar6;
  ulong uVar7;
  double dVar8;
  allocator_type local_31;
  
  ::std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)__return_storage_ptr__,(long)(this->super_BaseCanonicalGrid).num_dimensions,&local_31)
  ;
  for (lVar6 = 0; lVar6 < (this->super_BaseCanonicalGrid).num_dimensions; lVar6 = lVar6 + 1) {
    ::std::vector<double,_std::allocator<double>_>::resize
              ((__return_storage_ptr__->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + lVar6,
               (long)(this->max_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar6] + 1);
    dVar1 = x[lVar6];
    puVar3 = (__return_storage_ptr__->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[lVar6].
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    *puVar3 = 0x3ff0000000000000;
    pdVar4 = (this->nodes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = (this->max_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar6];
    uVar5 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar5 = 0;
    }
    dVar8 = 1.0;
    for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      dVar8 = dVar8 * (dVar1 - pdVar4[uVar7]);
      puVar3[uVar7 + 1] = dVar8;
    }
    pdVar4 = (this->coeff).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      puVar3[uVar7 + 1] = (double)puVar3[uVar7 + 1] / pdVar4[uVar7 + 1];
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<T>> cacheBasisValues(const T x[]) const{
        std::vector<std::vector<T>> cache(num_dimensions);
        for(int j=0; j<num_dimensions; j++){
            cache[j].resize(max_levels[j] + 1);
            T b = 1.0;
            T this_x = x[j];
            cache[j][0] = b;
            for(int i=0; i<max_levels[j]; i++){
                b *= (this_x - nodes[i]);
                cache[j][i+1] = b;
            }
            for(int i=1; i<=max_levels[j]; i++){
                cache[j][i] /= coeff[i];
            }
        }
        return cache;
    }